

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

bool __thiscall CCheckQueue<FakeCheck>::Loop(CCheckQueue<FakeCheck> *this,bool fMaster)

{
  CCheckQueue<FakeCheck> *pCVar1;
  long lVar2;
  uint uVar3;
  FakeCheck *check;
  void *pvVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  ulong uVar6;
  CCheckQueue<FakeCheck> CVar7;
  long lVar8;
  CCheckQueue<FakeCheck> *pCVar9;
  long in_FS_OFFSET;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  void *local_68;
  void *pvStack_60;
  long local_58;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar9 = this + 0x28;
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    pCVar9 = this + 0x58;
  }
  local_68 = (void *)0x0;
  pvStack_60 = (void *)0x0;
  local_58 = 0;
  std::vector<FakeCheck,_std::allocator<FakeCheck>_>::reserve
            ((vector<FakeCheck,_std::allocator<FakeCheck>_> *)&local_68,
             (ulong)*(uint *)(this + 0xb0));
  uVar6 = 0;
  CVar7 = (CCheckQueue<FakeCheck>)0x1;
  do {
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    if ((int)uVar6 == 0) {
      *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + 1;
    }
    else {
      this[0xa8] = (CCheckQueue<FakeCheck>)((byte)this[0xa8] & (byte)CVar7);
      pCVar1 = this + 0xac;
      *(int *)pCVar1 = *(int *)pCVar1 - (int)uVar6;
      if (*(int *)pCVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      lVar2 = *(long *)(this + 0x90);
      if ((*(long *)(this + 0x88) != lVar2) || (this[0xd0] != (CCheckQueue<FakeCheck>)0x0)) break;
      if ((fMaster) && (*(int *)(this + 0xac) == 0)) {
        *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + -1;
        CVar7 = this[0xa8];
        this[0xa8] = (CCheckQueue<FakeCheck>)0x1;
        goto LAB_0031defd;
      }
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + 1;
      std::condition_variable::wait((unique_lock *)pCVar9);
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + -1;
    }
    if (this[0xd0] != (CCheckQueue<FakeCheck>)0x0) {
      CVar7 = (CCheckQueue<FakeCheck>)0x0;
LAB_0031defd:
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      if (local_68 != (void *)0x0) {
        operator_delete(local_68,local_58 - (long)local_68);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (bool)CVar7;
      }
      __stack_chk_fail();
    }
    uVar3 = (uint)((int)lVar2 - (int)*(long *)(this + 0x88)) /
            (*(int *)(this + 0xa4) + *(int *)(this + 0xa0) + 1U);
    uVar5 = *(uint *)(this + 0xb0);
    if (uVar3 < *(uint *)(this + 0xb0)) {
      uVar5 = uVar3;
    }
    uVar6 = (ulong)(uVar5 + (uVar5 == 0));
    lVar8 = lVar2 - uVar6;
    std::vector<FakeCheck,std::allocator<FakeCheck>>::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<FakeCheck*,std::vector<FakeCheck,std::allocator<FakeCheck>>>>>
              ((vector<FakeCheck,std::allocator<FakeCheck>> *)&local_68,lVar8,lVar2);
    if (lVar8 != *(long *)(this + 0x90)) {
      *(long *)(this + 0x90) = lVar8;
    }
    CVar7 = this[0xa8];
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pvVar4 = local_68;
    if (local_68 != pvStack_60) {
      do {
        if (((byte)CVar7 & 1) != 0) {
          CVar7 = (CCheckQueue<FakeCheck>)0x1;
        }
        pvVar4 = (void *)((long)pvVar4 + 1);
      } while (pvVar4 != pvStack_60);
      if (local_68 != pvStack_60) {
        pvStack_60 = local_68;
      }
    }
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }